

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_>::listInit
          (list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *this)

{
  listNode<ft::pair<int,_int>_> *plVar1;
  node *pnVar2;
  listNode<ft::pair<int,_int>_> local_38;
  
  pnVar2 = (node *)operator_new(0x18);
  this->m_head = pnVar2;
  pnVar2 = (node *)operator_new(0x18);
  this->m_tail = pnVar2;
  local_38.data.first = 0;
  local_38.data.second = 0;
  local_38.prev = (listNode<ft::pair<int,_int>_> *)0x0;
  local_38.next = (listNode<ft::pair<int,_int>_> *)0x0;
  listNode<ft::pair<int,_int>_>::listNode(this->m_head,&local_38);
  local_38.data.first = 0;
  local_38.data.second = 0;
  local_38.prev = (listNode<ft::pair<int,_int>_> *)0x0;
  local_38.next = (listNode<ft::pair<int,_int>_> *)0x0;
  listNode<ft::pair<int,_int>_>::listNode(this->m_tail,&local_38);
  pnVar2 = this->m_head;
  plVar1 = this->m_tail;
  pnVar2->next = plVar1;
  plVar1->prev = pnVar2;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}